

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.c
# Opt level: O1

int func_look(void)

{
  int iVar1;
  t_func *ptVar2;
  
  iVar1 = symhash();
  ptVar2 = (t_func *)(func_tbl + iVar1);
  do {
    ptVar2 = ptVar2->next;
    func_ptr = ptVar2;
    if (ptVar2 == (t_func *)0x0) break;
    iVar1 = strcmp(symbol + 1,ptVar2->name);
  } while (iVar1 != 0);
  return (int)(ptVar2 != (t_func *)0x0);
}

Assistant:

int
func_look(void)
{
	int hash;

	/* search the function in the hash table */
	hash = symhash();
	func_ptr = func_tbl[hash];
	while (func_ptr) {
		if (!strcmp(&symbol[1], func_ptr->name))
			break;			
		func_ptr = func_ptr->next;
	}

	/* ok */
	if (func_ptr)
		return (1);

	/* didn't find a function with this name */
	return (0);
}